

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_>::ModeAdd
          (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *this,idx_t row)

{
  DataChunk *result;
  ColumnDataScanState *state;
  size_t sVar1;
  reference pvVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  key_type *__k;
  
  state = this->scan;
  if ((state->next_row_index <= row) || (uVar3 = state->current_row_index, row < uVar3)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,row,state,result);
    pvVar2 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (unsigned_long *)pvVar2->data;
    pvVar2 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar2);
    this->validity = &pvVar2->validity;
    uVar3 = this->scan->current_row_index;
  }
  __k = this->data + (uint)((int)row - (int)uVar3);
  pmVar4 = ::std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar1 = pmVar4->count;
  uVar3 = sVar1 + 1;
  pmVar4->count = uVar3;
  if (sVar1 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar4->first_row = row;
  }
  else {
    uVar6 = pmVar4->first_row;
    if (row < pmVar4->first_row) {
      uVar6 = row;
    }
    pmVar4->first_row = uVar6;
  }
  if (this->count < uVar3) {
    this->valid = true;
    this->count = uVar3;
    if (this->mode == (unsigned_long *)0x0) {
      puVar5 = (unsigned_long *)operator_new(8);
      *puVar5 = *__k;
      this->mode = puVar5;
    }
    else {
      *this->mode = *__k;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}